

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_mtrie_impl.hpp
# Opt level: O1

void __thiscall
zmq::generic_mtrie_t<zmq::pipe_t>::match<zmq::xpub_t*>
          (generic_mtrie_t<zmq::pipe_t> *this,prefix_t data_,size_t size_,
          _func_void_value_t_ptr_xpub_t_ptr *func_,xpub_t *arg_)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  pipes_t *ppVar4;
  _Rb_tree_node_base *p_Var5;
  _next_t *p_Var6;
  bool bVar7;
  
  do {
    ppVar4 = this->_pipes;
    if (ppVar4 != (pipes_t *)0x0) {
      for (p_Var5 = (ppVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var5 != &(ppVar4->_M_t)._M_impl.super__Rb_tree_header;
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
        (*func_)(*(value_t **)(p_Var5 + 1),arg_);
      }
    }
    bVar7 = size_ == 0;
    size_ = size_ - 1;
    if (bVar7) {
      return;
    }
    uVar3 = this->_count;
    if (uVar3 == 1) {
      if (*data_ != this->_min) {
        return;
      }
      p_Var6 = &this->_next;
    }
    else {
      if (uVar3 == 0) {
        return;
      }
      bVar1 = *data_;
      bVar2 = this->_min;
      if (bVar1 < bVar2) {
        return;
      }
      if ((uint)uVar3 + (uint)bVar2 <= (uint)bVar1) {
        return;
      }
      p_Var6 = (_next_t *)(&((this->_next).node)->_pipes + (int)((uint)bVar1 - (uint)bVar2));
    }
    this = p_Var6->node;
    data_ = data_ + 1;
    if (this == (generic_mtrie_t<zmq::pipe_t> *)0x0) {
      return;
    }
  } while( true );
}

Assistant:

void generic_mtrie_t<T>::match (prefix_t data_,
                                size_t size_,
                                void (*func_) (value_t *pipe_, Arg arg_),
                                Arg arg_)
{
    for (generic_mtrie_t *current = this; current; data_++, size_--) {
        //  Signal the pipes attached to this node.
        if (current->_pipes) {
            for (typename pipes_t::iterator it = current->_pipes->begin (),
                                            end = current->_pipes->end ();
                 it != end; ++it) {
                func_ (*it, arg_);
            }
        }

        //  If we are at the end of the message, there's nothing more to match.
        if (!size_)
            break;

        //  If there are no subnodes in the trie, return.
        if (current->_count == 0)
            break;

        if (current->_count == 1) {
            //  If there's one subnode (optimisation).
            if (data_[0] != current->_min) {
                break;
            }
            current = current->_next.node;
        } else {
            //  If there are multiple subnodes.
            if (data_[0] < current->_min
                || data_[0] >= current->_min + current->_count) {
                break;
            }
            current = current->_next.table[data_[0] - current->_min];
        }
    }
}